

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utmpset.c
# Opt level: O0

int main(int argc,char **argv,char **envp)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  int wtmp;
  int opt;
  char **envp_local;
  char **argv_local;
  int argc_local;
  
  bVar1 = false;
  progname = *argv;
LAB_001025ef:
  do {
    iVar2 = sgetoptmine(argc,argv,"wV");
    if (iVar2 == subgetoptdone) {
      ppcVar3 = argv + subgetoptind;
      if ((ppcVar3 == (char **)0x0) || (*ppcVar3 == (char *)0x0)) {
        usage();
      }
      iVar2 = utmp_logout(*ppcVar3);
      if (iVar2 == -1) {
        strerr_die(0x6f,"utmpset: warning: ","unable to logout line ",*ppcVar3,
                   " in utmp: no such entry",(char *)0x0,(char *)0x0,(strerr *)0x0);
      }
      if ((bVar1) && (iVar2 = wtmp_logout(*ppcVar3), iVar2 == -1)) {
        strerr_die(0x6f,"utmpset: warning: ","unable to logout line ",*ppcVar3," in wtmp: ",
                   (char *)0x0,(char *)0x0,&strerr_sys);
      }
      _exit(0);
    }
    if (iVar2 != 0x3f) {
      if (iVar2 != 0x56) {
        if (iVar2 == 0x77) {
          bVar1 = true;
        }
        goto LAB_001025ef;
      }
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    }
    usage();
  } while( true );
}

Assistant:

int main (int argc, const char * const *argv, const char * const *envp) {
  int opt;
  int wtmp =0;

  progname =*argv;

  while ((opt =getopt(argc, argv, "wV")) != opteof) {
    switch(opt) {
    case 'w':
      wtmp =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;

  if (! argv || ! *argv) usage();
  if (utmp_logout(*argv) == -1)
    strerr_die4x(111, WARNING, "unable to logout line ", *argv,
                 " in utmp: no such entry");
  if (wtmp)
    if (wtmp_logout(*argv) == -1)
      strerr_die4sys(111, WARNING,
                     "unable to logout line ", *argv, " in wtmp: ");
  _exit(0);
}